

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msf_gif.h
# Opt level: O2

void msf_free_gif_state(MsfGifState *handle)

{
  MsfGifBuffer *pMVar1;
  MsfGifBuffer *__ptr;
  
  free((handle->previousFrame).pixels);
  free((handle->currentFrame).pixels);
  free(handle->lzwMem);
  __ptr = handle->listHead;
  while (__ptr != (MsfGifBuffer *)0x0) {
    pMVar1 = __ptr->next;
    free(__ptr);
    __ptr = pMVar1;
  }
  handle->listHead = (MsfGifBuffer *)0x0;
  return;
}

Assistant:

static void msf_free_gif_state(MsfGifState * handle) {
    if (handle->previousFrame.pixels) MSF_GIF_FREE(handle->customAllocatorContext, handle->previousFrame.pixels,
                                                   handle->width * handle->height * sizeof(uint32_t));
    if (handle->currentFrame.pixels)  MSF_GIF_FREE(handle->customAllocatorContext, handle->currentFrame.pixels,
                                                   handle->width * handle->height * sizeof(uint32_t));
    if (handle->lzwMem) MSF_GIF_FREE(handle->customAllocatorContext, handle->lzwMem, lzwAllocSize);
    for (MsfGifBuffer * node = handle->listHead; node;) {
        MsfGifBuffer * next = node->next; //NOTE: we have to copy the `next` pointer BEFORE freeing the node holding it
        MSF_GIF_FREE(handle->customAllocatorContext, node, offsetof(MsfGifBuffer, data) + node->size);
        node = next;
    }
    handle->listHead = NULL; //this implicitly marks the handle as invalid until the next msf_gif_begin() call
}